

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O3

void SHA256_Transform(SHA256_CTX *c,uchar *data)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  
  auVar2 = *(undefined1 (*) [16])c->h;
  auVar3 = *(undefined1 (*) [16])(c->h + 4);
  lVar17 = 0;
  uVar11 = c->h[0];
  uVar10 = c->h[1];
  uVar15 = c->h[2];
  uVar18 = c->h[3];
  uVar13 = c->h[4];
  uVar12 = c->h[5];
  uVar5 = c->h[6];
  uVar8 = c->h[7];
  do {
    uVar9 = uVar5;
    uVar5 = uVar12;
    uVar12 = uVar13;
    uVar14 = uVar15;
    uVar15 = uVar10;
    uVar10 = uVar11;
    uVar11 = *(uint *)(data + lVar17);
    uVar1 = swap_bytes(uVar11);
    *(undefined4 *)((long)c->data + lVar17) = uVar1;
    iVar16 = (~uVar12 & uVar9 | uVar5 & uVar12) + uVar8 +
             ((uVar12 >> 0x19 | uVar12 << 7) ^
             (uVar12 >> 0xb | uVar12 << 0x15) ^ (uVar12 >> 6 | uVar12 << 0x1a)) +
             (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18) +
             *(int *)((long)K256 + lVar17);
    lVar17 = lVar17 + 4;
    uVar13 = uVar18 + iVar16;
    uVar11 = (uVar15 & uVar14 ^ (uVar15 ^ uVar14) & uVar10) +
             ((uVar10 >> 0x16 | uVar10 << 10) ^
             (uVar10 >> 0xd | uVar10 << 0x13) ^ (uVar10 >> 2 | uVar10 << 0x1e)) + iVar16;
    uVar18 = uVar14;
    uVar8 = uVar9;
  } while (lVar17 != 0x40);
  lVar17 = 0x1e;
  do {
    uVar8 = uVar15;
    uVar15 = uVar10;
    uVar6 = uVar5;
    uVar5 = uVar12;
    uVar12 = uVar13;
    uVar10 = uVar11;
    uVar13 = (uint)lVar17;
    uVar11 = c->data[uVar13 - 0xd & 0xf];
    uVar18 = c->data[uVar13 & 0xf];
    iVar16 = *(int *)(&UNK_00119888 + lVar17 * 4);
    lVar17 = lVar17 + 1;
    uVar7 = uVar13 - 0xe & 0xf;
    uVar11 = (uVar11 >> 3 ^ (uVar11 >> 0x12 | uVar11 << 0xe) ^ (uVar11 >> 7 | uVar11 << 0x19)) +
             c->data[uVar13 - 5 & 0xf] +
             (uVar18 >> 10 ^ (uVar18 >> 0x13 | uVar18 << 0xd) ^ (uVar18 >> 0x11 | uVar18 << 0xf)) +
             c->data[uVar7];
    c->data[uVar7] = uVar11;
    iVar16 = uVar11 + (~uVar12 & uVar6 | uVar5 & uVar12) + uVar9 +
                      ((uVar12 >> 0x19 | uVar12 << 7) ^
                      (uVar12 >> 0xb | uVar12 << 0x15) ^ (uVar12 >> 6 | uVar12 << 0x1a)) + iVar16;
    uVar13 = uVar14 + iVar16;
    uVar11 = (uVar15 & uVar8 ^ (uVar15 ^ uVar8) & uVar10) +
             ((uVar10 >> 0x16 | uVar10 << 10) ^
             (uVar10 >> 0xd | uVar10 << 0x13) ^ (uVar10 >> 2 | uVar10 << 0x1e)) + iVar16;
    uVar9 = uVar6;
    uVar14 = uVar8;
  } while (lVar17 != 0x4e);
  auVar4 = vpinsrd_avx(ZEXT416(uVar11),uVar10,1);
  auVar4 = vpinsrd_avx(auVar4,uVar15,2);
  auVar4 = vpinsrd_avx(auVar4,uVar8,3);
  auVar2 = vpaddd_avx(auVar4,auVar2);
  *(undefined1 (*) [16])c->h = auVar2;
  auVar2 = vpinsrd_avx(ZEXT416(uVar13),uVar12,1);
  auVar2 = vpinsrd_avx(auVar2,uVar5,2);
  auVar2 = vpinsrd_avx(auVar2,uVar6,3);
  auVar2 = vpaddd_avx(auVar2,auVar3);
  *(undefined1 (*) [16])(c->h + 4) = auVar2;
  return;
}

Assistant:

void SHA256_Transform(SHA256_CTX* context, const sha2_word32* data) {
	sha2_word32	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word32	T1, T2, *W256;
	int		j;

	W256 = (sha2_word32*)context->buffer;

	/* Initialize registers with the prev. intermediate value */
	a = context->state[0];
	b = context->state[1];
	c = context->state[2];
	d = context->state[3];
	e = context->state[4];
	f = context->state[5];
	g = context->state[6];
	h = context->state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Copy data while converting to host byte order */
		REVERSE32(*data++,W256[j]);
		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + W256[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-256 compression function to update a..h with copy */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + (W256[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W256[(j+1)&0x0f];
		s0 = sigma0_256(s0);
		s1 = W256[(j+14)&0x0f];	
		s1 = sigma1_256(s1);

		/* Apply the SHA-256 compression function to update a..h */
		T1 = h + Sigma1_256(e) + Ch(e, f, g) + K256[j] + 
		     (W256[j&0x0f] += s1 + W256[(j+9)&0x0f] + s0);
		T2 = Sigma0_256(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 64);

	/* Compute the current intermediate hash value */
	context->state[0] += a;
	context->state[1] += b;
	context->state[2] += c;
	context->state[3] += d;
	context->state[4] += e;
	context->state[5] += f;
	context->state[6] += g;
	context->state[7] += h;
}